

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O0

void __thiscall DImpactDecal::DImpactDecal(DImpactDecal *this,double z)

{
  double z_local;
  DImpactDecal *this_local;
  
  DBaseDecal::DBaseDecal(&this->super_DBaseDecal,2,z);
  (this->super_DBaseDecal).super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00a04058;
  ImpactCount = ImpactCount + 1;
  return;
}

Assistant:

DImpactDecal::DImpactDecal (double z)
: DBaseDecal (STAT_AUTODECAL, z)
{
	ImpactCount++;
}